

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableSlow<>(ArenaStringPtr *this,Arena *arena)

{
  string *psVar1;
  
  if (arena == (Arena *)0x0) {
    psVar1 = (string *)operator_new(0x20);
  }
  else {
    if (((byte)arena[0x18] & 1) != 0) {
      MutableSlow<>((ArenaStringPtr *)arena);
    }
    psVar1 = (string *)
             ArenaImpl::AllocateAlignedAndAddCleanup
                       ((ArenaImpl *)arena,0x20,arena_destruct_object<std::__cxx11::string>);
  }
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  (this->tagged_ptr_).ptr_ = psVar1;
  return psVar1;
}

Assistant:

std::string* ArenaStringPtr::MutableSlow(::google::protobuf::Arena* arena,
                                         const Lazy&... lazy_default) {
  const std::string* const default_value =
      sizeof...(Lazy) == 0 ? &GetEmptyStringAlreadyInited() : nullptr;
  GOOGLE_DCHECK(IsDefault(default_value));
  std::string* new_string =
      Arena::Create<std::string>(arena, lazy_default.get()...);
  tagged_ptr_.Set(new_string);
  return new_string;
}